

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
slang::ast::ElabSystemTaskSymbol::getMessage
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          ElabSystemTaskSymbol *this)

{
  long lVar1;
  Scope *pSVar2;
  Compilation *this_00;
  long lVar3;
  Type *args_00;
  char *pcVar4;
  undefined7 uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  SyntaxNode *this_01;
  ExpressionSyntax *pEVar11;
  undefined4 extraout_var;
  ASTContext *pAVar12;
  ElabSystemTaskSymbol *this_02;
  __extent_storage<18446744073709551615UL> in_R8;
  pointer ppEVar13;
  LookupLocation LVar14;
  SourceRange sourceRange;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> args_01;
  iterator __begin2;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  SourceLocation SStack_d0;
  Scope *local_c8;
  undefined1 local_b8;
  SyntaxNode *local_b0;
  undefined1 local_a8 [24];
  undefined1 local_90 [40];
  undefined1 local_68 [56];
  
  if (this->resolved == true) {
    uVar5 = *(undefined7 *)
             &(this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = (this->message).
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      field_0x11 = uVar5;
    pcVar4 = (this->message).
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_str;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len =
         (this->message).
         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
         _M_payload._M_value._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar4;
    return __return_storage_ptr__;
  }
  this->resolved = true;
  lVar1 = *(long *)((this->super_Symbol).originatingSyntax + 4);
  if (lVar1 == 0) {
    std::optional<std::basic_string_view<char,std::char_traits<char>>>::operator=
              ((optional<std::basic_string_view<char,std::char_traits<char>>> *)&this->message,
               (char (*) [1])0x4175a7);
    pcVar4 = (this->message).
             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
             ._M_payload.
             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
             _M_payload._M_value._M_str;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_len =
         (this->message).
         super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
         _M_payload.
         super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
         _M_payload._M_value._M_len;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_payload._M_value._M_str = pcVar4;
    uVar5 = *(undefined7 *)
             &(this->message).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = (this->message).
                 super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      field_0x11 = uVar5;
    return __return_storage_ptr__;
  }
  pSVar2 = (this->super_Symbol).parentScope;
  this_00 = pSVar2->compilation;
  LVar14 = LookupLocation::before(&this->super_Symbol);
  local_68._8_4_ = LVar14.index;
  local_68._16_8_ = 0;
  local_68._24_8_ = (SourceLocation)0x0;
  local_68._48_8_ = (AssertionInstanceDetails *)0x0;
  local_a8._0_8_ = local_90;
  local_a8._8_8_ = (pointer)0x0;
  local_68._32_8_ = (TempVarSymbol *)0x0;
  local_68._40_8_ = (RandomizeDetails *)0x0;
  local_a8._16_8_ = (char *)0x5;
  SStack_d0 = (SourceLocation)0x0;
  lVar3 = *(long *)(lVar1 + 0x58);
  local_d8 = (undefined1  [8])(lVar1 + 0x28U);
  local_68._0_8_ = pSVar2;
  for (; (uVar8 = local_a8._8_8_, uVar7 = local_a8._0_8_,
         local_d8 != (undefined1  [8])(lVar1 + 0x28U) ||
         (SStack_d0 != (SourceLocation)(lVar3 + 1U >> 1)));
      SStack_d0 = (SourceLocation)((long)SStack_d0 + 1)) {
    this_01 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ArgumentSyntax>::
               iterator_base<slang::syntax::ArgumentSyntax_*>::dereference
                         ((iterator_base<slang::syntax::ArgumentSyntax_*> *)(local_e8 + 0x10))->
               super_SyntaxNode;
    if (this_01->kind == EmptyArgument) {
      args_00 = this_00->voidType;
      local_e8 = (undefined1  [16])slang::syntax::SyntaxNode::sourceRange(this_01);
      local_b0 = (SyntaxNode *)
                 BumpAllocator::
                 emplace<slang::ast::EmptyArgumentExpression,slang::ast::Type_const&,slang::SourceRange>
                           (&this_00->super_BumpAllocator,args_00,(SourceRange *)local_e8);
      this_02 = (ElabSystemTaskSymbol *)&local_b0;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_a8,(Expression **)this_02);
    }
    else {
      if (this_01->kind != OrderedArgument) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange(this_01);
        this_02 = (ElabSystemTaskSymbol *)0x790007;
        ASTContext::addDiag((ASTContext *)local_68,(DiagCode)0x790007,sourceRange);
        goto LAB_00226a84;
      }
      this_02 = *(ElabSystemTaskSymbol **)(this_01 + 1);
      pEVar11 = ASTContext::requireSimpleExpr((ASTContext *)local_68,(PropertyExprSyntax *)this_02);
      if (pEVar11 == (ExpressionSyntax *)0x0) goto LAB_00226a84;
      iVar10 = Expression::bind((int)pEVar11,(sockaddr *)local_68,0);
      auVar6 = local_e8;
      local_e8._4_4_ = extraout_var;
      local_e8._0_4_ = iVar10;
      local_e8._8_8_ = auVar6._8_8_;
      this_02 = (ElabSystemTaskSymbol *)local_e8;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_a8,(Expression **)this_02);
    }
    bVar9 = Expression::bad(*(Expression **)(local_a8._0_8_ + local_a8._8_8_ * 8 + -8));
    if (bVar9) goto LAB_00226a84;
  }
  pAVar12 = (ASTContext *)local_a8._0_8_;
  if ((pointer)local_a8._8_8_ == (pointer)0x0) {
    ppEVar13 = (pointer)0x0;
  }
  else {
    if (this->taskKind == StaticAssert) {
      this_02 = (ElabSystemTaskSymbol *)((not_null<const_slang::ast::Scope_*> *)local_a8._0_8_)->ptr
      ;
      bVar9 = ASTContext::requireBooleanConvertible((ASTContext *)local_68,(Expression *)this_02);
      if (!bVar9) {
LAB_00226a84:
        (__return_storage_ptr__->
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged = false;
LAB_00226b1f:
        SmallVectorBase<const_slang::ast::Expression_*>::cleanup
                  ((SmallVectorBase<const_slang::ast::Expression_*> *)local_a8,
                   (EVP_PKEY_CTX *)this_02);
        return __return_storage_ptr__;
      }
      this_02 = (ElabSystemTaskSymbol *)local_68;
      ASTContext::eval((ConstantValue *)(local_e8 + 0x10),(ASTContext *)this_02,
                       (Expression *)((not_null<const_slang::ast::Scope_*> *)uVar7)->ptr,
                       (bitmask<slang::ast::EvalFlags>)0x0);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)(local_e8 + 0x10));
      if (local_b8 == 0) goto LAB_00226a84;
      this->assertCondition = (Expression *)((not_null<const_slang::ast::Scope_*> *)uVar7)->ptr;
    }
    else {
      ppEVar13 = (pointer)local_a8._8_8_;
      if (this->taskKind != Fatal) goto LAB_00226ae3;
      this_02 = (ElabSystemTaskSymbol *)((not_null<const_slang::ast::Scope_*> *)local_a8._0_8_)->ptr
      ;
      bVar9 = FmtHelpers::checkFinishNum((ASTContext *)local_68,(Expression *)this_02);
      if (!bVar9) goto LAB_00226a84;
    }
    ppEVar13 = (pointer)(uVar8 - 1);
    pAVar12 = (ASTContext *)(uVar7 + 8);
  }
LAB_00226ae3:
  this_02 = (ElabSystemTaskSymbol *)local_68;
  args_01._M_extent._M_extent_value = in_R8._M_extent_value;
  args_01._M_ptr = ppEVar13;
  createMessage((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                (local_e8 + 0x10),this_02,pAVar12,args_01);
  *(Scope **)
   &(this->message).
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _M_engaged = local_c8;
  (this->message).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_len = (size_t)local_d8;
  (this->message).
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>._M_payload
  .super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>._M_payload.
  _M_value._M_str = (char *)SStack_d0;
  uVar5 = *(undefined7 *)
           &(this->message).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            field_0x11;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_engaged = (this->message).
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_engaged;
  *(undefined7 *)
   &(__return_storage_ptr__->
    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
    _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
    field_0x11 = uVar5;
  pcVar4 = (this->message).
           super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
           _M_payload.
           super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
           _M_payload._M_value._M_str;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len =
       (this->message).
       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
       _M_payload.
       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
       _M_payload._M_value._M_len;
  (__return_storage_ptr__->
  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>).
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = pcVar4;
  goto LAB_00226b1f;
}

Assistant:

std::optional<std::string_view> ElabSystemTaskSymbol::getMessage() const {
    if (resolved)
        return message;

    resolved = true;

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto argSyntax = syntax->as<ElabSystemTaskSyntax>().arguments;
    if (!argSyntax) {
        message = "";
        return message;
    }

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    // Bind all arguments.
    auto& comp = scope->getCompilation();
    ASTContext astCtx(*scope, LookupLocation::before(*this));
    SmallVector<const Expression*> args;
    for (auto arg : argSyntax->parameters) {
        switch (arg->kind) {
            case SyntaxKind::OrderedArgument: {
                const auto& oa = arg->as<OrderedArgumentSyntax>();
                if (auto exSyn = astCtx.requireSimpleExpr(*oa.expr))
                    args.push_back(&Expression::bind(*exSyn, astCtx));
                else
                    return {};
                break;
            }
            case SyntaxKind::NamedArgument:
                astCtx.addDiag(diag::NamedArgNotAllowed, arg->sourceRange());
                return {};
            case SyntaxKind::EmptyArgument:
                args.push_back(
                    comp.emplace<EmptyArgumentExpression>(comp.getVoidType(), arg->sourceRange()));
                break;
            default:
                SLANG_UNREACHABLE;
        }

        if (args.back()->bad())
            return {};
    }

    std::span<const Expression* const> argSpan = args;
    if (!argSpan.empty()) {
        if (taskKind == ElabSystemTaskKind::Fatal) {
            // If this is a $fatal task, check the finish number. We don't use this
            // for anything, but enforce that it's 0, 1, or 2.
            if (!FmtHelpers::checkFinishNum(astCtx, *argSpan[0]))
                return {};

            argSpan = argSpan.subspan(1);
        }
        else if (taskKind == ElabSystemTaskKind::StaticAssert) {
            // The first argument is the condition to check.
            if (!astCtx.requireBooleanConvertible(*argSpan[0]) || !astCtx.eval(*argSpan[0]))
                return {};

            assertCondition = argSpan[0];
            argSpan = argSpan.subspan(1);
        }
    }

    message = createMessage(astCtx, argSpan);
    return message;
}